

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_custom_4d(ggml_context *ctx,ggml_type type,int64_t ne0,int64_t ne1,int64_t ne2,int64_t ne3,
              ggml_tensor **args,int n_args,ggml_custom_op_t fun,int n_tasks,void *userdata)

{
  ggml_tensor *pgVar1;
  int64_t in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  int64_t in_R8;
  int64_t in_R9;
  int i;
  ggml_custom_op_params params;
  ggml_tensor *result;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar2;
  int64_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (9 < params.n_tasks) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x13b6,"GGML_ASSERT(%s) failed","n_args < GGML_MAX_SRC");
  }
  pgVar1 = ggml_new_tensor_4d((ggml_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                              (ggml_type)((ulong)in_RDX >> 0x20),in_RCX,in_R8,in_R9,
                              in_stack_ffffffffffffffc8);
  ggml_set_op_params((ggml_tensor *)params.userdata,
                     (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0x153eed)
  ;
  pgVar1->op = GGML_OP_CUSTOM;
  for (iVar2 = 0; iVar2 < params.n_tasks; iVar2 = iVar2 + 1) {
    pgVar1->src[iVar2] = *(ggml_tensor **)(params.fun + (long)iVar2 * 8);
  }
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_custom_4d(
        struct ggml_context * ctx,
        enum ggml_type        type,
        int64_t               ne0,
        int64_t               ne1,
        int64_t               ne2,
        int64_t               ne3,
        struct ggml_tensor ** args,
        int                   n_args,
        ggml_custom_op_t      fun,
        int                   n_tasks,
        void                * userdata) {

    GGML_ASSERT(n_args < GGML_MAX_SRC);

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, type, ne0, ne1, ne2, ne3);

    struct ggml_custom_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op = GGML_OP_CUSTOM;
    for (int i = 0; i < n_args; i++) {
        result->src[i] = args[i];
    }

    return result;
}